

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O1

void __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,symbol x,
          ulint i)

{
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  vector<bool,_std::allocator<bool>_> code;
  vector<bool,_std::allocator<bool>_> local_40;
  
  if (this->n != 0) {
    if (this->unary_string == false) {
      uVar3 = (ulong)x;
      pvVar1 = (this->codes).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->codes).
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x3333333333333333;
      if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::vector<bool,_std::allocator<bool>_>::vector(&local_40,pvVar1 + uVar3);
      insert(this,&local_40,0,0,i);
      if (local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_40.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
    }
    this->current_size = this->current_size + 1;
  }
  return;
}

Assistant:

void insert(symbol x, ulint i){

		if(n==0)
			return;

	#ifdef DEBUG
		if(i>current_size){

			cout << "ERROR (DynamicString): trying to insert in position outside current string : " << i << ">" << current_size << endl;
			exit(0);

		}

		if(current_freqs.at(x)>=freq.at(x)){

			cout << "ERROR (DynamicString): too many symbols " << (uint)x << " inserted!" << endl;
			exit(0);

		}

		current_freqs.at(x) += 1;

	#endif


		if(not unary_string){

			vector<bool> code = codes.at(x);//bitvector to be inserted in the wavelet tree
			insert(&code,0,0,i);

		}

		current_size++;

	}